

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_branch(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  abi_ptr_conflict addr;
  TCGContext_conflict2 *tcg_ctx;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i32 val;
  TCGLabel *l1;
  abi_ptr_conflict addr_00;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  target_ulong_conflict dest;
  
  tcg_ctx = s->uc->tcg_ctx;
  addr = s->pc;
  uVar4 = (byte)(insn >> 8) & 0xf;
  iVar5 = (uint)insn * 0x1000000;
  if (iVar5 == 0) {
    uVar1 = cpu_lduw_code_m68k(env,addr);
    s->pc = s->pc + 2;
    uVar6 = (uint)(short)uVar1;
  }
  else if (iVar5 == -0x1000000) {
    uVar1 = cpu_lduw_code_m68k(env,addr);
    addr_00 = s->pc + 2;
    s->pc = addr_00;
    uVar2 = cpu_lduw_code_m68k(env,addr_00);
    s->pc = s->pc + 2;
    uVar6 = uVar2 & 0xffff | uVar1 << 0x10;
  }
  else {
    uVar6 = iVar5 >> 0x18;
  }
  uVar3 = (ushort)uVar4;
  if (uVar3 == 1) {
    val = tcg_const_i32_m68k(tcg_ctx,s->pc);
    gen_push(s,val);
  }
  if (uVar3 < 2) {
    update_cc_op(s);
    dest = uVar6 + addr;
  }
  else {
    l1 = gen_new_label_m68k(tcg_ctx);
    gen_jmpcc(s,uVar4 ^ 1,l1);
    gen_jmp_tb(s,1,uVar6 + addr);
    *(byte *)l1 = *(byte *)l1 | 1;
    tcg_gen_op1_m68k(tcg_ctx,INDEX_op_set_label,(TCGArg)l1);
    dest = s->pc;
  }
  gen_jmp_tb(s,0,dest);
  return;
}

Assistant:

DISAS_INSN(branch)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int32_t offset;
    uint32_t base;
    int op;

    base = s->pc;
    op = (insn >> 8) & 0xf;
    offset = (int8_t)insn;
    if (offset == 0) {
        offset = (int16_t)read_im16(env, s);
    } else if (offset == -1) {
        offset = read_im32(env, s);
    }
    if (op == 1) {
        /* bsr */
        gen_push(s, tcg_const_i32(tcg_ctx, s->pc));
    }
    if (op > 1) {
        /* Bcc */
        TCGLabel *l1 = gen_new_label(tcg_ctx);
        gen_jmpcc(s, ((insn >> 8) & 0xf) ^ 1, l1);
        gen_jmp_tb(s, 1, base + offset);
        gen_set_label(tcg_ctx, l1);
        gen_jmp_tb(s, 0, s->pc);
    } else {
        /* Unconditional branch.  */
        update_cc_op(s);
        gen_jmp_tb(s, 0, base + offset);
    }
}